

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfUtil.c
# Opt level: O0

int Cnf_DataSolveFromFile
              (char *pFileName,int nConfLimit,int nLearnedStart,int nLearnedDelta,int nLearnedPerce,
              int fVerbose,int fShowPattern,int **ppModel,int nPis)

{
  int iVar1;
  uint uVar2;
  abctime aVar3;
  Cnf_Dat_t *p;
  abctime aVar4;
  sat_solver *s;
  int *piVar5;
  int local_54;
  int RetValue;
  int status;
  int i;
  sat_solver *pSat;
  Cnf_Dat_t *pCnf;
  abctime clk;
  int fVerbose_local;
  int nLearnedPerce_local;
  int nLearnedDelta_local;
  int nLearnedStart_local;
  int nConfLimit_local;
  char *pFileName_local;
  
  aVar3 = Abc_Clock();
  p = Cnf_DataReadFromFile(pFileName);
  if (p == (Cnf_Dat_t *)0x0) {
    pFileName_local._4_4_ = -1;
  }
  else {
    if (fVerbose != 0) {
      printf("CNF stats: Vars = %6d. Clauses = %7d. Literals = %8d. ",(ulong)(uint)p->nVars,
             (ulong)(uint)p->nClauses,(ulong)(uint)p->nLiterals);
      aVar4 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar4 - aVar3);
    }
    s = (sat_solver *)Cnf_DataWriteIntoSolver(p,1,0);
    if (s == (sat_solver *)0x0) {
      printf("The problem is trivially UNSAT.\n");
      Cnf_DataFree(p);
      pFileName_local._4_4_ = 1;
    }
    else {
      if (nLearnedStart != 0) {
        s->nLearntMax = nLearnedStart;
        s->nLearntStart = nLearnedStart;
      }
      if (nLearnedDelta != 0) {
        s->nLearntDelta = nLearnedDelta;
      }
      if (nLearnedPerce != 0) {
        s->nLearntRatio = nLearnedPerce;
      }
      if (fVerbose != 0) {
        s->fVerbose = fVerbose;
      }
      iVar1 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,(long)nConfLimit,0,0,0);
      if (iVar1 == 0) {
        local_54 = -1;
      }
      else if (iVar1 == 1) {
        local_54 = 0;
      }
      else {
        if (iVar1 != -1) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfUtil.c"
                        ,0x1bb,
                        "int Cnf_DataSolveFromFile(char *, int, int, int, int, int, int, int **, int)"
                       );
        }
        local_54 = 1;
      }
      if (fVerbose != 0) {
        Sat_SolverPrintStats(_stdout,s);
      }
      if (local_54 == -1) {
        Abc_Print(1,"UNDECIDED      ");
      }
      else if (local_54 == 0) {
        Abc_Print(1,"SATISFIABLE    ");
      }
      else {
        Abc_Print(1,"UNSATISFIABLE  ");
      }
      aVar4 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar4 - aVar3);
      if ((local_54 == 0) && (0 < nPis)) {
        piVar5 = (int *)malloc((long)nPis << 2);
        *ppModel = piVar5;
        for (RetValue = 0; RetValue < nPis; RetValue = RetValue + 1) {
          iVar1 = sat_solver_var_value(s,(p->nVars - nPis) + RetValue);
          (*ppModel)[RetValue] = iVar1;
        }
      }
      if ((local_54 == 0) && (fShowPattern != 0)) {
        for (RetValue = 0; RetValue < p->nVars; RetValue = RetValue + 1) {
          uVar2 = sat_solver_var_value(s,RetValue);
          printf("%d",(ulong)uVar2);
        }
        printf("\n");
      }
      Cnf_DataFree(p);
      sat_solver_delete(s);
      pFileName_local._4_4_ = local_54;
    }
  }
  return pFileName_local._4_4_;
}

Assistant:

int Cnf_DataSolveFromFile( char * pFileName, int nConfLimit, int nLearnedStart, int nLearnedDelta, int nLearnedPerce, int fVerbose, int fShowPattern, int ** ppModel, int nPis )
{
    abctime clk = Abc_Clock();
    Cnf_Dat_t * pCnf = Cnf_DataReadFromFile( pFileName );
    sat_solver * pSat;
    int i, status, RetValue = -1;
    if ( pCnf == NULL )
        return -1;
    if ( fVerbose )
    {
        printf( "CNF stats: Vars = %6d. Clauses = %7d. Literals = %8d. ", pCnf->nVars, pCnf->nClauses, pCnf->nLiterals );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    // convert into SAT solver
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    if ( pSat == NULL )
    {
        printf( "The problem is trivially UNSAT.\n" );
        Cnf_DataFree( pCnf );
        return 1;
    }
    if ( nLearnedStart )
        pSat->nLearntStart = pSat->nLearntMax = nLearnedStart;
    if ( nLearnedDelta )
        pSat->nLearntDelta = nLearnedDelta;
    if ( nLearnedPerce )
        pSat->nLearntRatio = nLearnedPerce;
    if ( fVerbose )
        pSat->fVerbose = fVerbose;

//sat_solver_start_cardinality( pSat, 100 );

    // solve the miter
    status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)nConfLimit, 0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( status == l_Undef )
        RetValue = -1;
    else if ( status == l_True )
        RetValue = 0;
    else if ( status == l_False )
        RetValue = 1;
    else
        assert( 0 );
    if ( fVerbose )
        Sat_SolverPrintStats( stdout, pSat );
    if ( RetValue == -1 )
        Abc_Print( 1, "UNDECIDED      " );
    else if ( RetValue == 0 )
        Abc_Print( 1, "SATISFIABLE    " );
    else
        Abc_Print( 1, "UNSATISFIABLE  " );
    //Abc_Print( -1, "\n" );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    // derive SAT assignment
    if ( RetValue == 0 && nPis > 0 )
    {
        *ppModel = ABC_ALLOC( int, nPis );
        for ( i = 0; i < nPis; i++ )
            (*ppModel)[i] = sat_solver_var_value( pSat, pCnf->nVars - nPis + i );
    }
    if ( RetValue == 0 && fShowPattern )
    {
        for ( i = 0; i < pCnf->nVars; i++ )
            printf( "%d", sat_solver_var_value(pSat,i) );
        printf( "\n" );
    }
    Cnf_DataFree( pCnf );
    sat_solver_delete( pSat );
    return RetValue;
}